

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::TransformNode::calculateInDegree(TransformNode *this)

{
  size_t sVar1;
  
  sVar1 = (this->super_Node).indegree;
  (this->super_Node).indegree = sVar1 + 1;
  if (sVar1 == 0) {
    (*(((this->child).ptr)->super_RefCount)._vptr_RefCount[6])();
    if (1 < (this->spaces).spaces.size_active) {
      (*(((this->child).ptr)->super_RefCount)._vptr_RefCount[6])();
      return;
    }
  }
  return;
}

Assistant:

void SceneGraph::TransformNode::calculateInDegree()
  {
    indegree++;
    if (indegree == 1) {
      child->calculateInDegree();
      if (spaces.size() > 1) child->calculateInDegree(); // break instance up when motion blur is used
    }
  }